

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error externalEntityInitProcessor2(XML_Parser parser,char *start,char *end,char **endPtr)

{
  int iVar1;
  char **ppcStack_38;
  int tok;
  char *next;
  char **endPtr_local;
  char *end_local;
  char *start_local;
  XML_Parser parser_local;
  
  ppcStack_38 = (char **)start;
  next = (char *)endPtr;
  endPtr_local = (char **)end;
  end_local = start;
  start_local = (char *)parser;
  iVar1 = (*parser->m_encoding->scanners[1])
                    (parser->m_encoding,start,end,(char **)&stack0xffffffffffffffc8);
  if (iVar1 == -2) {
    if (start_local[0x37c] == '\0') {
      *(char **)next = end_local;
      parser_local._4_4_ = XML_ERROR_NONE;
    }
    else {
      *(char **)(start_local + 0x210) = end_local;
      parser_local._4_4_ = XML_ERROR_PARTIAL_CHAR;
    }
  }
  else if (iVar1 == -1) {
    if (start_local[0x37c] == '\0') {
      *(char **)next = end_local;
      parser_local._4_4_ = XML_ERROR_NONE;
    }
    else {
      *(char **)(start_local + 0x210) = end_local;
      parser_local._4_4_ = XML_ERROR_UNCLOSED_TOKEN;
    }
  }
  else {
    if (iVar1 == 0xe) {
      if ((ppcStack_38 == endPtr_local) && (start_local[0x37c] == '\0')) {
        *(char ***)next = ppcStack_38;
        return XML_ERROR_NONE;
      }
      end_local = (char *)ppcStack_38;
    }
    *(code **)(start_local + 0x200) = externalEntityInitProcessor3;
    parser_local._4_4_ =
         externalEntityInitProcessor3
                   ((XML_Parser)start_local,end_local,(char *)endPtr_local,(char **)next);
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error PTRCALL
externalEntityInitProcessor2(XML_Parser parser,
                             const char *start,
                             const char *end,
                             const char **endPtr)
{
  const char *next = start; /* XmlContentTok doesn't always set the last arg */
  int tok = XmlContentTok(encoding, start, end, &next);
  switch (tok) {
  case XML_TOK_BOM:
    /* If we are at the end of the buffer, this would cause the next stage,
       i.e. externalEntityInitProcessor3, to pass control directly to
       doContent (by detecting XML_TOK_NONE) without processing any xml text
       declaration - causing the error XML_ERROR_MISPLACED_XML_PI in doContent.
    */
    if (next == end && !ps_finalBuffer) {
      *endPtr = next;
      return XML_ERROR_NONE;
    }
    start = next;
    break;
  case XML_TOK_PARTIAL:
    if (!ps_finalBuffer) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_UNCLOSED_TOKEN;
  case XML_TOK_PARTIAL_CHAR:
    if (!ps_finalBuffer) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_PARTIAL_CHAR;
  }
  processor = externalEntityInitProcessor3;
  return externalEntityInitProcessor3(parser, start, end, endPtr);
}